

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

_Bool ggml_are_same_stride(ggml_tensor *t0,ggml_tensor *t1)

{
  if (((t0->nb[0] == t1->nb[0]) && (t0->nb[1] == t1->nb[1])) && (t0->nb[2] == t1->nb[2])) {
    return t0->nb[3] == t1->nb[3];
  }
  return false;
}

Assistant:

bool ggml_are_same_stride(const struct ggml_tensor * t0, const struct ggml_tensor * t1) {
    static_assert(GGML_MAX_DIMS == 4, "GGML_MAX_DIMS is not 4 - update this function");

    return
        (t0->nb[0] == t1->nb[0]) &&
        (t0->nb[1] == t1->nb[1]) &&
        (t0->nb[2] == t1->nb[2]) &&
        (t0->nb[3] == t1->nb[3]);
}